

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_roa_request.cpp
# Opt level: O0

string * getHttpGmtTime_abi_cxx11_(void)

{
  tm *__tp;
  string *in_RDI;
  allocator<char> local_99;
  char acStack_98 [8];
  char szBuf [128];
  time_t t;
  
  szBuf._120_8_ = time((time_t *)0x0);
  szBuf[0x68] = '\0';
  szBuf[0x69] = '\0';
  szBuf[0x6a] = '\0';
  szBuf[0x6b] = '\0';
  szBuf[0x6c] = '\0';
  szBuf[0x6d] = '\0';
  szBuf[0x6e] = '\0';
  szBuf[0x6f] = '\0';
  szBuf[0x70] = '\0';
  szBuf[0x71] = '\0';
  szBuf[0x72] = '\0';
  szBuf[0x73] = '\0';
  szBuf[0x74] = '\0';
  szBuf[0x75] = '\0';
  szBuf[0x76] = '\0';
  szBuf[0x77] = '\0';
  szBuf[0x58] = '\0';
  szBuf[0x59] = '\0';
  szBuf[0x5a] = '\0';
  szBuf[0x5b] = '\0';
  szBuf[0x5c] = '\0';
  szBuf[0x5d] = '\0';
  szBuf[0x5e] = '\0';
  szBuf[0x5f] = '\0';
  szBuf[0x60] = '\0';
  szBuf[0x61] = '\0';
  szBuf[0x62] = '\0';
  szBuf[99] = '\0';
  szBuf[100] = '\0';
  szBuf[0x65] = '\0';
  szBuf[0x66] = '\0';
  szBuf[0x67] = '\0';
  szBuf[0x48] = '\0';
  szBuf[0x49] = '\0';
  szBuf[0x4a] = '\0';
  szBuf[0x4b] = '\0';
  szBuf[0x4c] = '\0';
  szBuf[0x4d] = '\0';
  szBuf[0x4e] = '\0';
  szBuf[0x4f] = '\0';
  szBuf[0x50] = '\0';
  szBuf[0x51] = '\0';
  szBuf[0x52] = '\0';
  szBuf[0x53] = '\0';
  szBuf[0x54] = '\0';
  szBuf[0x55] = '\0';
  szBuf[0x56] = '\0';
  szBuf[0x57] = '\0';
  szBuf[0x38] = '\0';
  szBuf[0x39] = '\0';
  szBuf[0x3a] = '\0';
  szBuf[0x3b] = '\0';
  szBuf[0x3c] = '\0';
  szBuf[0x3d] = '\0';
  szBuf[0x3e] = '\0';
  szBuf[0x3f] = '\0';
  szBuf[0x40] = '\0';
  szBuf[0x41] = '\0';
  szBuf[0x42] = '\0';
  szBuf[0x43] = '\0';
  szBuf[0x44] = '\0';
  szBuf[0x45] = '\0';
  szBuf[0x46] = '\0';
  szBuf[0x47] = '\0';
  szBuf[0x28] = '\0';
  szBuf[0x29] = '\0';
  szBuf[0x2a] = '\0';
  szBuf[0x2b] = '\0';
  szBuf[0x2c] = '\0';
  szBuf[0x2d] = '\0';
  szBuf[0x2e] = '\0';
  szBuf[0x2f] = '\0';
  szBuf[0x30] = '\0';
  szBuf[0x31] = '\0';
  szBuf[0x32] = '\0';
  szBuf[0x33] = '\0';
  szBuf[0x34] = '\0';
  szBuf[0x35] = '\0';
  szBuf[0x36] = '\0';
  szBuf[0x37] = '\0';
  szBuf[0x18] = '\0';
  szBuf[0x19] = '\0';
  szBuf[0x1a] = '\0';
  szBuf[0x1b] = '\0';
  szBuf[0x1c] = '\0';
  szBuf[0x1d] = '\0';
  szBuf[0x1e] = '\0';
  szBuf[0x1f] = '\0';
  szBuf[0x20] = '\0';
  szBuf[0x21] = '\0';
  szBuf[0x22] = '\0';
  szBuf[0x23] = '\0';
  szBuf[0x24] = '\0';
  szBuf[0x25] = '\0';
  szBuf[0x26] = '\0';
  szBuf[0x27] = '\0';
  szBuf[8] = '\0';
  szBuf[9] = '\0';
  szBuf[10] = '\0';
  szBuf[0xb] = '\0';
  szBuf[0xc] = '\0';
  szBuf[0xd] = '\0';
  szBuf[0xe] = '\0';
  szBuf[0xf] = '\0';
  szBuf[0x10] = '\0';
  szBuf[0x11] = '\0';
  szBuf[0x12] = '\0';
  szBuf[0x13] = '\0';
  szBuf[0x14] = '\0';
  szBuf[0x15] = '\0';
  szBuf[0x16] = '\0';
  szBuf[0x17] = '\0';
  acStack_98[0] = '\0';
  acStack_98[1] = '\0';
  acStack_98[2] = '\0';
  acStack_98[3] = '\0';
  acStack_98[4] = '\0';
  acStack_98[5] = '\0';
  acStack_98[6] = '\0';
  acStack_98[7] = '\0';
  szBuf[0] = '\0';
  szBuf[1] = '\0';
  szBuf[2] = '\0';
  szBuf[3] = '\0';
  szBuf[4] = '\0';
  szBuf[5] = '\0';
  szBuf[6] = '\0';
  szBuf[7] = '\0';
  __tp = gmtime((time_t *)(szBuf + 0x78));
  strftime(acStack_98,0x7f,"%a, %d %b %Y %H:%M:%S",__tp);
  strcat(acStack_98," GMT");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,acStack_98,&local_99);
  std::allocator<char>::~allocator(&local_99);
  return in_RDI;
}

Assistant:

std::string getHttpGmtTime() {
  time_t t = time(NULL);
  char szBuf[128]={0};
  strftime(szBuf , 127 , "%a, %d %b %Y %H:%M:%S" , gmtime(&t));
  strcat(szBuf, " GMT");
  return szBuf;
}